

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O1

double Utils::CubicNorm(Matrix *m)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  undefined8 local_28;
  
  iVar1 = Matrix::GetRows(m);
  if (iVar1 < 1) {
    local_28 = 0.0;
  }
  else {
    iVar1 = 0;
    dVar5 = 0.0;
    do {
      iVar2 = Matrix::GetCols(m);
      local_28 = 0.0;
      if (0 < iVar2) {
        local_28 = 0.0;
        iVar2 = 0;
        do {
          dVar4 = Matrix::operator()(m,iVar1,iVar2);
          local_28 = local_28 + ABS(dVar4);
          iVar2 = iVar2 + 1;
          iVar3 = Matrix::GetCols(m);
        } while (iVar2 < iVar3);
      }
      if (local_28 <= dVar5) {
        local_28 = dVar5;
      }
      iVar1 = iVar1 + 1;
      iVar2 = Matrix::GetRows(m);
      dVar5 = local_28;
    } while (iVar1 < iVar2);
  }
  return local_28;
}

Assistant:

double Utils::CubicNorm(const Matrix& m)
{
    double norm = 0;
    for (int i = 0; i < m.GetRows(); ++i)
    {
        double sum = 0;
        for (int j = 0; j < m.GetCols(); ++j)
        {
            sum += std::abs(m(i, j));
        }
        norm = std::max(norm, sum);
    }
    return norm;
}